

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageExtractor.cpp
# Opt level: O1

int Assimp_Extract(char **params,uint num)

{
  aiTexture *tx;
  bool bVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  byte bVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  aiScene *paVar10;
  size_t sVar11;
  FILE *__s;
  ulong uVar12;
  char **ppcVar13;
  char *unaff_RBP;
  char **ppcVar14;
  bool bVar15;
  char *pcVar16;
  char *pcVar17;
  size_type sVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  ulong uVar20;
  bool bVar21;
  string out_cpy;
  string extension;
  string out;
  char tmp [10];
  string out_ext;
  string in;
  ImportData import;
  long *local_140 [2];
  long local_130 [2];
  uint local_120;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  char **local_f8;
  string local_f0;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  uint local_b0;
  char local_aa [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  ImportData local_60;
  
  if (num == 0) {
    puts("assimp extract: Invalid number of arguments. See \'assimp extract --help\'");
    return 1;
  }
  pcVar16 = *params;
  iVar6 = strcmp(pcVar16,"-h");
  if (((iVar6 == 0) || (iVar6 = strcmp(pcVar16,"--help"), iVar6 == 0)) ||
     (iVar6 = strcmp(pcVar16,"-?"), iVar6 == 0)) {
    printf("%s",AICMD_MSG_DUMP_HELP_E);
    return 0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,pcVar16,(allocator<char> *)&local_60);
  if (num == 1) {
    local_d0 = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"-","");
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,params[1],&local_119);
  }
  local_60.logFile._M_dataplus._M_p = (pointer)&local_60.logFile.field_2;
  local_60.ppFlags = 0;
  local_60.showLog = false;
  local_60.logFile._M_string_length = 0;
  local_60.logFile.field_2._M_local_buf[0] = '\0';
  local_60.verbose = false;
  local_60.log = false;
  ProcessStandardArguments(&local_60,params + 1,num - 1);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"bmp","");
  uVar7 = ((char)*local_d0 != '-') + 1;
  if (uVar7 < num) {
    uVar20 = (ulong)uVar7;
    uVar7 = 0xffffffff;
    local_120 = 0;
    bVar4 = 0;
    local_f8 = params;
    do {
      unaff_RBP = params[uVar20];
      if (unaff_RBP != (char *)0x0) {
        iVar6 = strncmp(unaff_RBP,"-f",2);
        if (iVar6 == 0) {
          local_140[0] = local_130;
          sVar11 = strlen(unaff_RBP + 2);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_140,unaff_RBP + 2,unaff_RBP + sVar11 + 2);
        }
        else {
          iVar6 = strncmp(unaff_RBP,"--format=",9);
          if (iVar6 != 0) {
            iVar6 = strcmp(unaff_RBP,"--nosuffix");
            if ((iVar6 == 0) || (iVar6 = strcmp(unaff_RBP,"-s"), iVar6 == 0)) {
              bVar4 = 1;
            }
            else {
              iVar6 = strncmp(unaff_RBP,"--texture=",10);
              if (iVar6 == 0) {
                cVar5 = unaff_RBP[10];
                if ((byte)(cVar5 - 0x3aU) < 0xf6) {
LAB_002eb927:
                  uVar7 = 0;
                }
                else {
                  unaff_RBP = unaff_RBP + 0xb;
                  uVar7 = 0;
                  do {
                    uVar7 = (uint)(byte)(cVar5 - 0x30) + uVar7 * 10;
                    cVar5 = *unaff_RBP;
                    unaff_RBP = unaff_RBP + 1;
                  } while (0xf5 < (byte)(cVar5 - 0x3aU));
                }
              }
              else {
                iVar6 = strncmp(unaff_RBP,"-t",2);
                if (iVar6 == 0) {
                  cVar5 = unaff_RBP[2];
                  if ((byte)(cVar5 - 0x3aU) < 0xf6) goto LAB_002eb927;
                  unaff_RBP = unaff_RBP + 3;
                  uVar7 = 0;
                  do {
                    uVar7 = (uint)(byte)(cVar5 - 0x30) + uVar7 * 10;
                    cVar5 = *unaff_RBP;
                    unaff_RBP = unaff_RBP + 1;
                  } while (0xf5 < (byte)(cVar5 - 0x3aU));
                }
                else {
                  iVar6 = strcmp(unaff_RBP,"-ba");
                  if ((iVar6 == 0) || (iVar6 = strcmp(unaff_RBP,"--bmp-with-alpha"), iVar6 == 0)) {
                    local_120 = 1;
                  }
                }
              }
            }
            goto LAB_002eb8dd;
          }
          local_140[0] = local_130;
          sVar11 = strlen(unaff_RBP + 9);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_140,unaff_RBP + 9,unaff_RBP + sVar11 + 9);
        }
        std::__cxx11::string::operator=((string *)&local_f0,(string *)local_140);
        params = local_f8;
        if (local_140[0] != local_130) {
          operator_delete(local_140[0],local_130[0] + 1);
          params = local_f8;
        }
      }
LAB_002eb8dd:
      uVar20 = uVar20 + 1;
    } while ((uint)uVar20 != num);
  }
  else {
    bVar4 = 0;
    uVar7 = 0xffffffff;
    local_120 = 0;
  }
  sVar3 = local_f0._M_string_length;
  _Var2._M_p = local_f0._M_dataplus._M_p;
  if (local_f0._M_string_length != 0) {
    sVar18 = 0;
    do {
      iVar6 = tolower((int)_Var2._M_p[sVar18]);
      _Var2._M_p[sVar18] = (char)iVar6;
      sVar18 = sVar18 + 1;
    } while (sVar3 != sVar18);
  }
  if ((char)*local_d0 == '-') {
    std::__cxx11::string::rfind((char)&local_80,0x2e);
    std::__cxx11::string::substr((ulong)local_140,(ulong)&local_80);
    std::__cxx11::string::operator=((string *)&local_d0,(string *)local_140);
    if (local_140[0] != local_130) {
      operator_delete(local_140[0],local_130[0] + 1);
    }
  }
  lVar9 = std::__cxx11::string::rfind((char)&local_d0,0x2e);
  if (lVar9 != -1) {
    std::__cxx11::string::substr((ulong)local_140,(ulong)&local_d0);
    std::__cxx11::string::operator=((string *)&local_f0,(string *)local_140);
    if (local_140[0] != local_130) {
      operator_delete(local_140[0],local_130[0] + 1);
    }
    std::__cxx11::string::substr((ulong)local_140,(ulong)&local_d0);
    std::__cxx11::string::operator=((string *)&local_d0,(string *)local_140);
    if (local_140[0] != local_130) {
      operator_delete(local_140[0],local_130[0] + 1);
    }
  }
  paVar10 = ImportModel(&local_60,&local_80);
  if (paVar10 == (aiScene *)0x0) {
    printf("assimp extract: Unable to load input file %s\n",local_80._M_dataplus._M_p);
    iVar6 = 5;
  }
  else {
    bVar21 = uVar7 == 0xffffffff;
    if (bVar21) {
      printf("assimp extract: Exporting %i textures\n",(ulong)paVar10->mNumTextures);
    }
    else if (paVar10->mNumTextures <= uVar7) {
      printf("assimp extract: Texture %i requested, but there are just %i textures\n",(ulong)uVar7);
      iVar6 = 6;
      goto LAB_002ebecc;
    }
    if (paVar10->mNumTextures != 0) {
      ppcVar14 = (char **)(ulong)uVar7;
      ppcVar13 = (char **)0x0;
      local_f8 = ppcVar14;
      do {
        if (uVar7 == 0xffffffff || ppcVar13 == ppcVar14) {
          tx = paVar10->mTextures[(long)ppcVar13];
          local_140[0] = local_130;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_140,local_d0,(char *)((long)local_d0 + local_c8));
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,local_f0._M_dataplus._M_p,
                     local_f0._M_dataplus._M_p + local_f0._M_string_length);
          if (!(bool)(bVar4 & uVar7 != 0xffffffff)) {
            std::__cxx11::string::append((char *)local_140);
            uVar8 = 1;
            uVar20 = (ulong)ppcVar13 & 0xffffffff;
            pcVar16 = local_aa;
            if ((int)ppcVar13 < 0) {
              local_aa[0] = '-';
              uVar20 = (ulong)(uint)-(int)ppcVar13;
              uVar8 = 2;
              pcVar16 = local_aa + 1;
            }
            iVar6 = 1000000000;
            bVar15 = false;
            do {
              pcVar17 = pcVar16;
              if (9 < uVar8) break;
              lVar9 = (long)(int)uVar20 / (long)iVar6;
              uVar12 = (long)(int)uVar20 % (long)iVar6 & 0xffffffff;
              if (((bVar15) || (iVar6 == 1)) || ((int)lVar9 != 0)) {
                pcVar17 = pcVar16 + 1;
                uVar8 = uVar8 + 1;
                *pcVar16 = (char)lVar9 + '0';
                bVar15 = true;
                uVar20 = uVar12;
                pcVar16 = pcVar17;
                if (iVar6 != 1) goto LAB_002ebc5d;
                bVar1 = false;
                iVar6 = 1;
              }
              else {
LAB_002ebc5d:
                iVar6 = iVar6 / 10;
                bVar1 = true;
                pcVar17 = pcVar16;
              }
              pcVar16 = pcVar17;
            } while (bVar1);
            unaff_RBP = (char *)((ulong)unaff_RBP & 0xffffffff);
            *pcVar17 = '\0';
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            sVar11 = strlen(local_aa);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_118,local_aa,local_aa + sVar11);
            std::__cxx11::string::_M_append((char *)local_140,(ulong)local_118._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
          }
          paVar19 = &local_118.field_2;
          if (tx->mHeight == 0) {
            local_b0 = (uint)unaff_RBP;
            pcVar16 = tx->achFormatHint;
            printf("assimp extract: Texture %i is compressed (%s). Writing native file format.\n",
                   (ulong)ppcVar13 & 0xffffffff,pcVar16);
            local_118._M_dataplus._M_p = (pointer)paVar19;
            sVar11 = strlen(pcVar16);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_118,pcVar16,tx->achFormatHint + sVar11);
            std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_118);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != paVar19) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            unaff_RBP = (char *)(ulong)local_b0;
          }
          std::operator+(&local_118,".",&local_a0);
          std::__cxx11::string::_M_append((char *)local_140,(ulong)local_118._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != paVar19) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          __s = fopen((char *)local_140[0],"wb");
          if (__s == (FILE *)0x0) {
            printf("assimp extract: Unable to open output file %s\n",local_140[0]);
            unaff_RBP = (char *)0x7;
            bVar15 = false;
          }
          else {
            if (tx->mHeight == 0) {
              sVar11 = fwrite(tx->pcData,(ulong)tx->mWidth,1,__s);
              pcVar16 = (char *)(ulong)(sVar11 != 1);
            }
            else {
              uVar8 = DoExport(tx,(FILE *)__s,&local_f0,local_120);
              pcVar16 = (char *)(ulong)uVar8;
            }
            fclose(__s);
            printf("assimp extract: Wrote texture %i to %s\n",(ulong)ppcVar13 & 0xffffffff,
                   local_140[0]);
            unaff_RBP = (char *)((ulong)unaff_RBP & 0xffffffff);
            bVar15 = bVar21;
            if (uVar7 != 0xffffffff) {
              unaff_RBP = pcVar16;
            }
          }
          iVar6 = (int)unaff_RBP;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if (local_140[0] != local_130) {
            operator_delete(local_140[0],local_130[0] + 1);
          }
          ppcVar14 = local_f8;
          if (!bVar15) goto LAB_002ebecc;
        }
        ppcVar13 = (char **)((long)ppcVar13 + 1);
      } while (ppcVar13 < (char **)(ulong)paVar10->mNumTextures);
    }
    iVar6 = 0;
  }
LAB_002ebecc:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.logFile._M_dataplus._M_p != &local_60.logFile.field_2) {
    operator_delete(local_60.logFile._M_dataplus._M_p,
                    CONCAT71(local_60.logFile.field_2._M_allocated_capacity._1_7_,
                             local_60.logFile.field_2._M_local_buf[0]) + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return iVar6;
}

Assistant:

int Assimp_Extract (const char* const* params, unsigned int num)
{
    const char* const invalid = "assimp extract: Invalid number of arguments. See \'assimp extract --help\'\n";
    // assimp extract in out [options]
    if (num < 1) {
        printf(invalid);
        return 1;
    }

    // --help
    if (!strcmp( params[0], "-h") || !strcmp( params[0], "--help") || !strcmp( params[0], "-?") ) {
        printf("%s",AICMD_MSG_DUMP_HELP_E);
        return 0;
    }



    std::string in  = std::string(params[0]);
    std::string out = (num > 1 ? std::string(params[1]) : "-");

    // get import flags
    ImportData import;
    ProcessStandardArguments(import,params+1,num-1);

    bool nosuffix = false;
    unsigned int texIdx  = 0xffffffff, flags = 0;

    // process other flags
    std::string extension = "bmp";
    for (unsigned int i = (out[0] == '-' ? 1 : 2); i < num;++i)		{
        if (!params[i]) {
            continue;
        }

        if (!strncmp( params[i], "-f",2)) {
            extension = std::string(params[i]+2);
        }
        else if ( !strncmp( params[i], "--format=",9)) {
            extension = std::string(params[i]+9);
        }
        else if ( !strcmp( params[i], "--nosuffix") || !strcmp(params[i],"-s")) {
            nosuffix = true;
        }
        else if ( !strncmp( params[i], "--texture=",10)) {
            texIdx = Assimp::strtoul10(params[i]+10);
        }
        else if ( !strncmp( params[i], "-t",2)) {
            texIdx = Assimp::strtoul10(params[i]+2);
        }
        else if ( !strcmp( params[i], "-ba") ||  !strcmp( params[i], "--bmp-with-alpha")) {
            flags |= AI_EXTRACT_WRITE_BMP_ALPHA;
        }
#if 0
        else {
            printf("Unknown parameter: %s\n",params[i]);
            return 10;
        }
#endif
    }

    std::transform(extension.begin(),extension.end(),extension.begin(),::tolower);
    
    if (out[0] == '-') {
        // take file name from input file
        std::string::size_type s = in.find_last_of('.');
        if (s == std::string::npos)
            s = in.length();

        out = in.substr(0,s);
    }

    // take file extension from file name, if given
    std::string::size_type s = out.find_last_of('.');
    if (s != std::string::npos) {
        extension = out.substr(s+1,in.length()-(s+1));
        out = out.substr(0,s);
    }

    // import the main model
    const aiScene* scene = ImportModel(import,in);
    if (!scene) {
        printf("assimp extract: Unable to load input file %s\n",in.c_str());
        return 5;
    }

    // get the texture(s) to be exported
    if (texIdx != 0xffffffff) {

        // check whether the requested texture is existing
        if (texIdx >= scene->mNumTextures) {
            ::printf("assimp extract: Texture %i requested, but there are just %i textures\n",
                texIdx, scene->mNumTextures);
            return 6;
        }
    }
    else {
        ::printf("assimp extract: Exporting %i textures\n",scene->mNumTextures);
    }

    // now write all output textures
    for (unsigned int i = 0; i < scene->mNumTextures;++i)	{
        if (texIdx != 0xffffffff && texIdx != i) {
            continue;
        }

        const aiTexture* tex = scene->mTextures[i];
        std::string out_cpy = out, out_ext = extension;

        // append suffix if necessary - always if all textures are exported
        if (!nosuffix || (texIdx == 0xffffffff)) {
            out_cpy.append  ("_img");
            char tmp[10];
            Assimp::ASSIMP_itoa10(tmp,i);

            out_cpy.append(std::string(tmp));
        }

        // if the texture is a compressed one, we'll export
        // it to its native file format
        if (!tex->mHeight) {
            printf("assimp extract: Texture %i is compressed (%s). Writing native file format.\n",
                i,tex->achFormatHint);

            // modify file extension
            out_ext = std::string(tex->achFormatHint);
        }
        out_cpy.append("."+out_ext);

        // open output file
        FILE* p = ::fopen(out_cpy.c_str(),"wb");
        if (!p)  {
            printf("assimp extract: Unable to open output file %s\n",out_cpy.c_str());
            return 7;
        }
        int m;

        if (!tex->mHeight) {
            m = (1 != fwrite(tex->pcData,tex->mWidth,1,p));
        }
        else m = DoExport(tex,p,extension,flags);
        ::fclose(p);

        printf("assimp extract: Wrote texture %i to %s\n",i, out_cpy.c_str());
        if (texIdx != 0xffffffff)
            return m;
    }
    return 0;
}